

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

EbmlElement * __thiscall
libebml::EbmlMaster::FindFirstElt(EbmlMaster *this,EbmlCallbacks *Callbacks,bool bCreateIfNull)

{
  pointer ppEVar1;
  int iVar2;
  undefined4 extraout_var;
  EbmlElement *pEVar3;
  size_t Index;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    ppEVar1 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->ElementList).
                      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar4) {
      if (bCreateIfNull) {
        pEVar3 = (*Callbacks->Create)();
        PushElement(this,pEVar3);
      }
      else {
        pEVar3 = (EbmlElement *)0x0;
      }
      return pEVar3;
    }
    pEVar3 = ppEVar1[uVar4];
    if (pEVar3 != (EbmlElement *)0x0) {
      iVar2 = (*pEVar3->_vptr_EbmlElement[3])();
      if ((Callbacks->GlobalId->Length == *(size_t *)((uint32 *)CONCAT44(extraout_var,iVar2) + 2))
         && (Callbacks->GlobalId->Value == *(uint32 *)CONCAT44(extraout_var,iVar2))) {
        return (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar4];
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

EbmlElement *EbmlMaster::FindFirstElt(const EbmlCallbacks & Callbacks, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (ElementList[Index] && EbmlId(*(ElementList[Index])) == EBML_INFO_ID(Callbacks))
      return ElementList[Index];
  }

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &EBML_INFO_CREATE(Callbacks);
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}